

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall HighsDomain::ConflictSet::pushQueue(ConflictSet *this,iterator domchg)

{
  pointer p_Var1;
  pointer p_Var2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  iterator domchg_local;
  
  domchg_local = domchg;
  std::
  vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
  ::emplace_back<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>&>
            ((vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
              *)&this->resolveQueue,&domchg_local);
  p_Var1 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = p_Var2[-1]._M_node;
  lVar5 = ((long)p_Var2 - (long)p_Var1 >> 3) + -1;
  while ((lVar4 = (lVar5 + -1) / 2, 0 < lVar5 &&
         ((int)p_Var1[lVar4]._M_node[1]._M_color < (int)p_Var3[1]._M_color))) {
    p_Var1[lVar5]._M_node = p_Var1[lVar4]._M_node;
    lVar5 = lVar4;
  }
  p_Var1[lVar5]._M_node = p_Var3;
  return;
}

Assistant:

void HighsDomain::ConflictSet::pushQueue(
    std::set<LocalDomChg>::iterator domchg) {
  resolveQueue.emplace_back(domchg);
  std::push_heap(
      resolveQueue.begin(), resolveQueue.end(),
      [](const std::set<LocalDomChg>::iterator& a,
         const std::set<LocalDomChg>::iterator& b) { return a->pos < b->pos; });
}